

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

bool LoadTonkLibrary(void)

{
  uint i;
  hmodule_t hModule;
  lock_guard<std::mutex> locker;
  char **paths;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar1;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  long lVar2;
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffe0,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  lVar2 = 0;
  uVar1 = 0;
  while ((kLibrarySearchPaths_64[uVar1] != (char *)0x0 &&
         (lVar2 = dlopen(kLibrarySearchPaths_64[uVar1],2), lVar2 == 0))) {
    uVar1 = uVar1 + 1;
  }
  fp_tonk_result_to_string = (fp_tonk_result_to_string_t)dlsym(lVar2,"tonk_result_to_string");
  if (fp_tonk_result_to_string == (fp_tonk_result_to_string_t)0x0) {
    local_1 = false;
  }
  else {
    fp_tonk_socket_create = (fp_tonk_socket_create_t)dlsym(lVar2,"tonk_socket_create");
    if (fp_tonk_socket_create == (fp_tonk_socket_create_t)0x0) {
      local_1 = false;
    }
    else {
      fp_tonk_advertise = (fp_tonk_advertise_t)dlsym(lVar2,"tonk_advertise");
      if (fp_tonk_advertise == (fp_tonk_advertise_t)0x0) {
        local_1 = false;
      }
      else {
        fp_tonk_inject = (fp_tonk_inject_t)dlsym(lVar2,"tonk_inject");
        if (fp_tonk_inject == (fp_tonk_inject_t)0x0) {
          local_1 = false;
        }
        else {
          fp_tonk_socket_destroy = (fp_tonk_socket_destroy_t)dlsym(lVar2,"tonk_socket_destroy");
          if (fp_tonk_socket_destroy == (fp_tonk_socket_destroy_t)0x0) {
            local_1 = false;
          }
          else {
            fp_tonk_connect = (fp_tonk_connect_t)dlsym(lVar2,"tonk_connect");
            if (fp_tonk_connect == (fp_tonk_connect_t)0x0) {
              local_1 = false;
            }
            else {
              fp_tonk_status = (fp_tonk_status_t)dlsym(lVar2,"tonk_status");
              if (fp_tonk_status == (fp_tonk_status_t)0x0) {
                local_1 = false;
              }
              else {
                fp_tonk_status_ex = (fp_tonk_status_ex_t)dlsym(lVar2,"tonk_status_ex");
                if (fp_tonk_status_ex == (fp_tonk_status_ex_t)0x0) {
                  local_1 = false;
                }
                else {
                  fp_tonk_send = (fp_tonk_send_t)dlsym(lVar2,"tonk_send");
                  if (fp_tonk_send == (fp_tonk_send_t)0x0) {
                    local_1 = false;
                  }
                  else {
                    fp_tonk_flush = (fp_tonk_flush_t)dlsym(lVar2,"tonk_flush");
                    if (fp_tonk_flush == (fp_tonk_flush_t)0x0) {
                      local_1 = false;
                    }
                    else {
                      fp_tonk_close = (fp_tonk_close_t)dlsym(lVar2,"tonk_close");
                      if (fp_tonk_close == (fp_tonk_close_t)0x0) {
                        local_1 = false;
                      }
                      else {
                        fp_tonk_free = (fp_tonk_free_t)dlsym(lVar2,"tonk_free");
                        if (fp_tonk_free == (fp_tonk_free_t)0x0) {
                          local_1 = false;
                        }
                        else {
                          fp_tonk_time = (fp_tonk_time_t)dlsym(lVar2,"tonk_time");
                          if (fp_tonk_time == (fp_tonk_time_t)0x0) {
                            local_1 = false;
                          }
                          else {
                            fp_tonk_to_remote_time_16 =
                                 (fp_tonk_to_remote_time_16_t)dlsym(lVar2,"tonk_to_remote_time_16");
                            if (fp_tonk_to_remote_time_16 == (fp_tonk_to_remote_time_16_t)0x0) {
                              local_1 = false;
                            }
                            else {
                              fp_tonk_from_local_time_16 =
                                   (fp_tonk_from_local_time_16_t)
                                   dlsym(lVar2,"tonk_from_local_time_16");
                              if (fp_tonk_from_local_time_16 == (fp_tonk_from_local_time_16_t)0x0) {
                                local_1 = false;
                              }
                              else {
                                fp_tonk_to_remote_time_23 =
                                     (fp_tonk_to_remote_time_23_t)
                                     dlsym(lVar2,"tonk_to_remote_time_23");
                                if (fp_tonk_to_remote_time_23 == (fp_tonk_to_remote_time_23_t)0x0) {
                                  local_1 = false;
                                }
                                else {
                                  fp_tonk_from_local_time_23 =
                                       (fp_tonk_from_local_time_23_t)
                                       dlsym(lVar2,"tonk_from_local_time_23");
                                  if (fp_tonk_from_local_time_23 ==
                                      (fp_tonk_from_local_time_23_t)0x0) {
                                    local_1 = false;
                                  }
                                  else {
                                    fp_tonk_p2p_connect =
                                         (fp_tonk_p2p_connect_t)dlsym(lVar2,"tonk_p2p_connect");
                                    if (fp_tonk_p2p_connect == (fp_tonk_p2p_connect_t)0x0) {
                                      local_1 = false;
                                    }
                                    else {
                                      fp_tonk_set_default_socket_config =
                                           (fp_tonk_set_default_socket_config_t)
                                           dlsym(lVar2,"tonk_set_default_socket_config");
                                      if (fp_tonk_set_default_socket_config ==
                                          (fp_tonk_set_default_socket_config_t)0x0) {
                                        local_1 = false;
                                      }
                                      else {
                                        fp_tonk_file_from_disk =
                                             (fp_tonk_file_from_disk_t)
                                             dlsym(lVar2,"tonk_file_from_disk");
                                        if (fp_tonk_file_from_disk == (fp_tonk_file_from_disk_t)0x0)
                                        {
                                          local_1 = false;
                                        }
                                        else {
                                          fp_tonk_file_from_buffer =
                                               (fp_tonk_file_from_buffer_t)
                                               dlsym(lVar2,"tonk_file_from_buffer");
                                          if (fp_tonk_file_from_buffer ==
                                              (fp_tonk_file_from_buffer_t)0x0) {
                                            local_1 = false;
                                          }
                                          else {
                                            fp_tonk_file_send =
                                                 (fp_tonk_file_send_t)dlsym(lVar2,"tonk_file_send");
                                            if (fp_tonk_file_send == (fp_tonk_file_send_t)0x0) {
                                              local_1 = false;
                                            }
                                            else {
                                              fp_tonk_file_receive =
                                                   (fp_tonk_file_receive_t)
                                                   dlsym(lVar2,"tonk_file_receive");
                                              if (fp_tonk_file_receive ==
                                                  (fp_tonk_file_receive_t)0x0) {
                                                local_1 = false;
                                              }
                                              else {
                                                fp_tonk_file_free =
                                                     (fp_tonk_file_free_t)
                                                     dlsym(lVar2,"tonk_file_free");
                                                if (fp_tonk_file_free == (fp_tonk_file_free_t)0x0) {
                                                  local_1 = false;
                                                }
                                                else {
                                                  local_1 = true;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x120dbc);
  return local_1;
}

Assistant:

static bool LoadTonkLibrary()
{
    const char** paths = (sizeof(void*) == 8) ? kLibrarySearchPaths_64 : kLibrarySearchPaths_32;

    std::lock_guard<std::mutex> locker(FunctionPointerLock);
    hmodule_t hModule = nullptr;
    for (unsigned i = 0; paths[i]; ++i)
    {
        hModule = TONK_LOAD_LIBRARY(paths[i]);
#ifdef TONK_CPP_SDK_DLL_VERBOSE
        if (hModule) {
            cout << "LoadTonkLibrary(" << paths[i] << "): Success=" << hModule << endl;
        }
        else {
#ifdef _WIN32
            const char* errStr = "";
#else
            const char* errStr = dlerror();
#endif
            cout << "LoadTonkLibrary(" << paths[i] << "): Failure code = " << errStr << endl;
        }
#endif
        if (hModule)
            break;
    }

    // Main API
    TONK_LOAD_FUNCTION(tonk_result_to_string);
    TONK_LOAD_FUNCTION(tonk_socket_create);
    TONK_LOAD_FUNCTION(tonk_advertise);
    TONK_LOAD_FUNCTION(tonk_inject);
    TONK_LOAD_FUNCTION(tonk_socket_destroy);
    TONK_LOAD_FUNCTION(tonk_connect);
    TONK_LOAD_FUNCTION(tonk_status);
    TONK_LOAD_FUNCTION(tonk_status_ex);
    TONK_LOAD_FUNCTION(tonk_send);
    TONK_LOAD_FUNCTION(tonk_flush);
    TONK_LOAD_FUNCTION(tonk_close);
    TONK_LOAD_FUNCTION(tonk_free);
    TONK_LOAD_FUNCTION(tonk_time);
    TONK_LOAD_FUNCTION(tonk_to_remote_time_16);
    TONK_LOAD_FUNCTION(tonk_from_local_time_16);
    TONK_LOAD_FUNCTION(tonk_to_remote_time_23);
    TONK_LOAD_FUNCTION(tonk_from_local_time_23);
    TONK_LOAD_FUNCTION(tonk_p2p_connect);
    TONK_LOAD_FUNCTION(tonk_set_default_socket_config);

    // File Transfer API
    TONK_LOAD_FUNCTION(tonk_file_from_disk);
    TONK_LOAD_FUNCTION(tonk_file_from_buffer);
    TONK_LOAD_FUNCTION(tonk_file_send);
    TONK_LOAD_FUNCTION(tonk_file_receive);
    TONK_LOAD_FUNCTION(tonk_file_free);

    return true;
}